

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O3

int Aig_ManVerifyUsingBdds_int(Aig_Man_t *p,Saig_ParBbr_t *pPars)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  DdManager *dd;
  long lVar7;
  Vec_Ptr_t *vOnionRings;
  void **ppvVar8;
  DdNode **pbOutputs;
  DdNode **pbParts;
  DdNode *n;
  DdNode *pDVar9;
  Abc_Cex_t *pAVar10;
  int fVerbose;
  DdManager *pDVar11;
  long lVar12;
  ulong uVar13;
  timespec ts;
  
  iVar6 = pPars->fSkipOutCheck;
  iVar2 = clock_gettime(3,(timespec *)&ts);
  if (iVar2 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  if (p->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/bbr/bbrReach.c"
                  ,0x1c0,"int Aig_ManVerifyUsingBdds_int(Aig_Man_t *, Saig_ParBbr_t *)");
  }
  dd = Aig_ManComputeGlobalBdds(p,pPars->nBddMax,1,pPars->fReorder,pPars->fVerbose);
  if (dd == (DdManager *)0x0) {
    if (pPars->fSilent != 0) {
      return -1;
    }
    printf("The number of intermediate BDD nodes exceeded the limit (%d).\n",
           (ulong)(uint)pPars->nBddMax);
    return -1;
  }
  if (pPars->fVerbose != 0) {
    uVar3 = Cudd_ReadKeys(dd);
    uVar4 = Cudd_ReadDead(dd);
    printf("Shared BDD size is %6d nodes.\n",(ulong)(uVar3 - uVar4));
  }
  iVar2 = pPars->TimeLimit;
  if ((long)iVar2 != 0) {
    iVar5 = clock_gettime(3,(timespec *)&ts);
    if (iVar5 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    if ((long)iVar2 <= (lVar7 - lVar12) / 1000000) {
      printf("Reached timeout after constructing global BDDs (%d seconds).\n",
             (ulong)(uint)pPars->TimeLimit);
      Cudd_Quit(dd);
      return -1;
    }
  }
  vOnionRings = (Vec_Ptr_t *)malloc(0x10);
  vOnionRings->nCap = 1000;
  vOnionRings->nSize = 0;
  pDVar11 = (DdManager *)0x1f40;
  ppvVar8 = (void **)malloc(8000);
  vOnionRings->pArray = ppvVar8;
  pbOutputs = Aig_ManCreateOutputs(pDVar11,p);
  pbParts = Aig_ManCreatePartitions(dd,p,pPars->fReorder,pPars->fVerbose);
  n = Aig_ManInitStateVarMap(dd,p,fVerbose);
  Cudd_Ref(n);
  if (pPars->fReorderImage != 0) {
    Cudd_AutodynEnable(dd,CUDD_REORDER_SYMM_SIFT);
  }
  iVar2 = p->nTruePos;
  if (0 < iVar2) {
    uVar13 = 0;
    do {
      if (iVar6 == 0) {
        pDVar9 = pbOutputs[uVar13];
        iVar2 = Cudd_bddLeq(dd,n,(DdNode *)((ulong)pDVar9 ^ 1));
        if (iVar2 == 0) {
          pDVar9 = Cudd_bddIntersect(dd,n,pDVar9);
          Cudd_Ref(pDVar9);
          if (p->pSeqModel != (Abc_Cex_t *)0x0) {
            __assert_fail("p->pSeqModel == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/bbr/bbrReach.c"
                          ,0x1ed,"int Aig_ManVerifyUsingBdds_int(Aig_Man_t *, Saig_ParBbr_t *)");
          }
          pAVar10 = Aig_ManVerifyUsingBddsCountExample
                              (p,dd,pbParts,vOnionRings,pDVar9,(int)uVar13,pPars->fVerbose,
                               pPars->fSilent);
          p->pSeqModel = pAVar10;
          pDVar11 = dd;
          Cudd_RecursiveDeref(dd,pDVar9);
          bVar1 = true;
          if (pPars->fSilent == 0) {
            Abc_Print((int)pDVar11,"Output %d of miter \"%s\" was asserted in frame %d. ",
                      uVar13 & 0xffffffff,p->pName,0xffffffff);
          }
          goto LAB_0082023b;
        }
        iVar2 = p->nTruePos;
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)iVar2);
  }
  bVar1 = false;
LAB_0082023b:
  if (0 < vOnionRings->nSize) {
    lVar7 = 0;
    do {
      Cudd_RecursiveDeref(dd,(DdNode *)vOnionRings->pArray[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar7 < vOnionRings->nSize);
  }
  if (vOnionRings->pArray != (void **)0x0) {
    free(vOnionRings->pArray);
  }
  free(vOnionRings);
  iVar2 = 0;
  if (!bVar1) {
    iVar2 = Aig_ManComputeReachable(dd,p,pbParts,n,pbOutputs,pPars,(uint)(iVar6 == 0));
  }
  Cudd_RecursiveDeref(dd,n);
  if (p->nRegs < 1) {
    if (pbParts != (DdNode **)0x0) goto LAB_0082030b;
  }
  else {
    lVar7 = 0;
    do {
      Cudd_RecursiveDeref(dd,pbParts[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar7 < p->nRegs);
LAB_0082030b:
    free(pbParts);
  }
  if (p->nTruePos < 1) {
    if (pbOutputs == (DdNode **)0x0) goto LAB_00820345;
  }
  else {
    lVar7 = 0;
    do {
      Cudd_RecursiveDeref(dd,pbOutputs[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar7 < p->nTruePos);
  }
  free(pbOutputs);
LAB_00820345:
  Cudd_Quit(dd);
  if (pPars->fSilent != 0) {
    return iVar2;
  }
  Abc_Print((int)dd,"%s =","Time");
  iVar2 = 3;
  iVar6 = clock_gettime(3,(timespec *)&ts);
  if (iVar6 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar7 - lVar12) / 1000000.0);
  fflush(_stdout);
}

Assistant:

int Aig_ManVerifyUsingBdds_int( Aig_Man_t * p, Saig_ParBbr_t * pPars )
{
    int fCheckOutputs = !pPars->fSkipOutCheck;
    DdManager * dd;
    DdNode ** pbParts, ** pbOutputs;
    DdNode * bInitial, * bTemp;
    int RetValue, i;
    abctime clk = Abc_Clock();
    Vec_Ptr_t * vOnionRings;

    assert( Saig_ManRegNum(p) > 0 );

    // compute the global BDDs of the latches
    dd = Aig_ManComputeGlobalBdds( p, pPars->nBddMax, 1, pPars->fReorder, pPars->fVerbose );    
    if ( dd == NULL )
    {
        if ( !pPars->fSilent )
            printf( "The number of intermediate BDD nodes exceeded the limit (%d).\n", pPars->nBddMax );
        return -1;
    }
    if ( pPars->fVerbose )
        printf( "Shared BDD size is %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

    // check the runtime limit
    if ( pPars->TimeLimit && pPars->TimeLimit <= (Abc_Clock()-clk)/CLOCKS_PER_SEC )
    {
        printf( "Reached timeout after constructing global BDDs (%d seconds).\n",  pPars->TimeLimit );
        Cudd_Quit( dd );
        return -1;
    }

    // start the onion rings
    vOnionRings = Vec_PtrAlloc( 1000 );

    // save outputs
    pbOutputs = Aig_ManCreateOutputs( dd, p );

    // create partitions
    pbParts = Aig_ManCreatePartitions( dd, p, pPars->fReorder, pPars->fVerbose );

    // create the initial state and the variable map
    bInitial  = Aig_ManInitStateVarMap( dd, p, pPars->fVerbose );  Cudd_Ref( bInitial );

    // set reordering
    if ( pPars->fReorderImage )
        Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );

    // check the result
    RetValue = -1;
    for ( i = 0; i < Saig_ManPoNum(p); i++ )
    {
        if ( fCheckOutputs && !Cudd_bddLeq( dd, bInitial, Cudd_Not(pbOutputs[i]) ) )
        {
            DdNode * bIntersect;
            bIntersect = Cudd_bddIntersect( dd, bInitial, pbOutputs[i] );  Cudd_Ref( bIntersect );
            assert( p->pSeqModel == NULL );
            p->pSeqModel = Aig_ManVerifyUsingBddsCountExample( p, dd, pbParts, 
                vOnionRings, bIntersect, i, pPars->fVerbose, pPars->fSilent ); 
            Cudd_RecursiveDeref( dd, bIntersect );
            if ( !pPars->fSilent )
                Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d. ", i, p->pName, -1 );
            RetValue = 0;
            break;
        }
    }
    // free the onion rings
    Vec_PtrForEachEntry( DdNode *, vOnionRings, bTemp, i )
        Cudd_RecursiveDeref( dd, bTemp );
    Vec_PtrFree( vOnionRings );
    // explore reachable states
    if ( RetValue == -1 )
        RetValue = Aig_ManComputeReachable( dd, p, pbParts, bInitial, pbOutputs, pPars, fCheckOutputs ); 

    // cleanup
    Cudd_RecursiveDeref( dd, bInitial );
    for ( i = 0; i < Saig_ManRegNum(p); i++ )
        Cudd_RecursiveDeref( dd, pbParts[i] );
    ABC_FREE( pbParts );
    for ( i = 0; i < Saig_ManPoNum(p); i++ )
        Cudd_RecursiveDeref( dd, pbOutputs[i] );
    ABC_FREE( pbOutputs );
//    if ( RetValue == -1 )
        Cudd_Quit( dd );
//    else
//        Bbr_StopManager( dd );

    // report the runtime
    if ( !pPars->fSilent )
    {
    ABC_PRT( "Time", Abc_Clock() - clk );
    fflush( stdout );
    }
    return RetValue;
}